

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O3

int find_minlength(pcre2_real_code_16 *re,PCRE2_SPTR16 code,PCRE2_SPTR16 startcode,BOOL utf,
                  recurse_check *recurses,int *countptr,int *backref_cache)

{
  PCRE2_UCHAR16 PVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  recurse_check **pprVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  PCRE2_SPTR16 pPVar10;
  PCRE2_SPTR16 pPVar11;
  recurse_check *prVar12;
  PCRE2_SPTR16 pPVar13;
  ushort *puVar14;
  ulong uVar15;
  uint8_t *puVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  recurse_check this_recurse;
  uint local_70;
  int local_6c;
  uint local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  recurse_check local_40;
  
  PVar1 = *code;
  if ((ushort)(PVar1 - 0x88) < 5) {
    return 0;
  }
  uVar3 = re->flags;
  iVar18 = *countptr;
  *countptr = iVar18 + 1;
  if (1000 < iVar18) {
    return -1;
  }
  local_6c = -1;
  iVar18 = 0;
  bVar5 = false;
  local_68 = 0;
  local_60 = 0;
  local_5c = 0xffffffff;
  local_54 = 0;
  local_58 = 0xffffffff;
  pPVar13 = code + (ulong)((ushort)(PVar1 - 0x85) < 2) + 2;
LAB_0015d18f:
  uVar2 = *pPVar13;
  uVar15 = (ulong)uVar2;
  switch(uVar15) {
  case 0:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
    if ((local_6c < 0) || ((!bVar5 && (iVar18 < local_6c)))) {
      local_6c = iVar18;
    }
    if (uVar2 != 0x78) {
      return local_6c;
    }
    puVar14 = pPVar13 + 2;
    bVar5 = false;
    iVar18 = 0;
    break;
  case 3:
  case 0x21:
  case 0x22:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x2a:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x97:
  case 0x99:
  case 0x9b:
  case 0x9d:
  case 0x9f:
  case 0xa2:
    goto switchD_0015d1ad_caseD_3;
  case 0xf:
  case 0x10:
    pPVar13 = pPVar13 + 2;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
    iVar18 = iVar18 + 1;
    puVar14 = pPVar13 + 1;
    break;
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x38:
  case 0x3d:
  case 0x3e:
  case 0x45:
  case 0x4a:
  case 0x4b:
  case 0x52:
    iVar18 = iVar18 + 1;
    goto LAB_0015d1e7;
  case 0x29:
  case 0x36:
  case 0x43:
  case 0x50:
    iVar18 = iVar18 + (uint)pPVar13[1];
    puVar14 = pPVar13 + 3;
    break;
  case 0x55:
  case 0x56:
  case 0x59:
  case 0x5a:
  case 0x5e:
  case 0x60:
    pPVar11 = pPVar13 + (ulong)((ushort)(pPVar13[1] - 0xf) < 2) * 2;
    goto LAB_0015d346;
  case 0x57:
  case 0x58:
  case 0x5f:
    iVar18 = iVar18 + 1;
    puVar14 = pPVar13 + (ulong)((ushort)(pPVar13[1] - 0xf) < 2) * 2 + 2;
    break;
  case 0x5b:
  case 0x5c:
  case 0x61:
    pPVar11 = pPVar13 + 2;
    if (1 < (ushort)(pPVar13[2] - 0xf)) {
      pPVar11 = pPVar13;
    }
LAB_0015d346:
    puVar14 = pPVar11 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                        [uVar15];
    break;
  case 0x5d:
    iVar18 = iVar18 + (uint)pPVar13[1];
    puVar14 = pPVar13 + (ulong)((ushort)(pPVar13[2] - 0xf) < 2) * 2 + 3;
    break;
  default:
    return -3;
  case 0x6e:
  case 0x6f:
  case 0x70:
    if (uVar2 == 0x70) {
      uVar15 = (ulong)pPVar13[1];
    }
    else {
      uVar15 = 0x11;
    }
    puVar14 = pPVar13 + uVar15;
    uVar7 = *puVar14 - 0x62;
    if (0xb < uVar7) {
      iVar18 = iVar18 + 1;
      break;
    }
    if ((0x533U >> (uVar7 & 0x1f) & 1) != 0) {
LAB_0015d696:
      puVar14 = puVar14 + 1;
      break;
    }
    if ((0x20cU >> (uVar7 & 0x1f) & 1) != 0) {
      iVar18 = iVar18 + 1;
      goto LAB_0015d696;
    }
    uVar7 = (uint)puVar14[1];
    puVar14 = puVar14 + 3;
    goto LAB_0015d74d;
  case 0x71:
  case 0x72:
    if ((uVar3 >> 0x15 & 1) != 0) {
      return -1;
    }
    uVar2 = pPVar13[1];
    if ((int)(uint)uVar2 <= *backref_cache) {
      uVar15 = (ulong)(uint)backref_cache[uVar2];
      lVar9 = 4;
      if (-1 < backref_cache[uVar2]) goto LAB_0015d8a3;
    }
    uVar7 = (uint)uVar2;
    if ((re->overall_options & 0x200) == 0) {
      pPVar11 = _pcre2_find_bracket_16(startcode,utf,uVar7);
      if (pPVar11 == (PCRE2_SPTR16)0x0) {
        return -2;
      }
      uVar15 = 0;
      pPVar10 = pPVar11;
      do {
        pPVar10 = pPVar10 + pPVar10[1];
      } while (*pPVar10 == 0x78);
      if ((pPVar11 < pPVar13) && (pPVar13 < pPVar10)) {
LAB_0015d5ff:
        bVar5 = true;
      }
      else {
        prVar12 = recurses;
        if (recurses != (recurse_check *)0x0) {
          do {
            if (prVar12->group == pPVar11) goto LAB_0015d5ff;
            pprVar6 = &prVar12->prev;
            prVar12 = *pprVar6;
          } while (*pprVar6 != (recurse_check *)0x0);
        }
        local_40.prev = recurses;
        local_40.group = pPVar11;
        uVar8 = find_minlength(re,pPVar11,startcode,utf,&local_40,countptr,backref_cache);
        uVar15 = (ulong)uVar8;
        if ((int)uVar8 < 0) {
          return uVar8;
        }
      }
    }
    else {
      uVar15 = 0;
    }
    backref_cache[uVar7] = (int)uVar15;
    iVar17 = *backref_cache;
    if (iVar17 + 1 < (int)uVar7) {
      memset(backref_cache + (long)iVar17 + 1,0xff,(ulong)((uVar7 - iVar17) - 2) * 4 + 4);
    }
    *backref_cache = uVar7;
    lVar9 = 4;
    goto LAB_0015d8a3;
  case 0x73:
  case 0x74:
    if ((uVar3 >> 0x15 & 1) != 0) {
      return -1;
    }
    uVar15 = 0;
    lVar9 = 6;
    if ((re->overall_options & 0x200) == 0) {
      if (pPVar13[2] == 0) {
        uVar15 = 0x7fffffff;
      }
      else {
        puVar16 = re[1].start_bitmap + (ulong)pPVar13[1] * (ulong)re->name_entry_size * 2 + -0x28;
        uVar7 = *backref_cache;
        local_70 = 0x7fffffff;
        uVar8 = (uint)pPVar13[2];
        do {
          uVar2 = *(ushort *)puVar16;
          if (((int)uVar7 < (int)(uint)uVar2) || (uVar19 = backref_cache[uVar2], (int)uVar19 < 0)) {
            pPVar10 = _pcre2_find_bracket_16(startcode,utf,(uint)uVar2);
            pPVar11 = pPVar10;
            if (pPVar10 == (PCRE2_SPTR16)0x0) {
              return -2;
            }
            do {
              pPVar11 = pPVar11 + pPVar11[1];
            } while (*pPVar11 == 0x78);
            uVar19 = 0;
            if ((pPVar10 < pPVar13) && (pPVar13 < pPVar11)) {
LAB_0015d45a:
              bVar5 = true;
            }
            else {
              prVar12 = recurses;
              if (recurses != (recurse_check *)0x0) {
                do {
                  if (prVar12->group == pPVar10) goto LAB_0015d45a;
                  pprVar6 = &prVar12->prev;
                  prVar12 = *pprVar6;
                } while (*pprVar6 != (recurse_check *)0x0);
              }
              local_40.prev = recurses;
              local_40.group = pPVar10;
              uVar19 = find_minlength(re,pPVar10,startcode,utf,&local_40,countptr,backref_cache);
              if ((int)uVar19 < 0) {
                return uVar19;
              }
            }
            backref_cache[(uint)uVar2] = uVar19;
            iVar17 = *backref_cache;
            if (iVar17 + 1 < (int)(uint)uVar2) {
              memset(backref_cache + (long)iVar17 + 1,0xff,
                     (ulong)(((uint)uVar2 - iVar17) - 2) * 4 + 4);
            }
            *backref_cache = (uint)uVar2;
            uVar7 = (uint)uVar2;
          }
          if ((int)uVar19 < (int)local_70) {
            local_70 = uVar19;
          }
          if (uVar19 == 0) break;
          puVar16 = puVar16 + (ulong)re->name_entry_size * 2;
          bVar4 = 1 < (int)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar4);
        uVar15 = (ulong)local_70;
        lVar9 = 6;
      }
    }
LAB_0015d8a3:
    puVar14 = (ushort *)(lVar9 + (long)pPVar13);
    uVar8 = 1;
    uVar7 = *(ushort *)((long)pPVar13 + lVar9) - 0x62;
    if (uVar7 < 0xc) {
      if ((0x533U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar7 & 0x1f) & 1) == 0) {
          uVar8 = (uint)puVar14[1];
          puVar14 = puVar14 + 3;
        }
        else {
          puVar14 = puVar14 + 1;
        }
      }
      else {
        puVar14 = puVar14 + 1;
        uVar8 = 0;
      }
    }
    if ((0 < (int)uVar15) && ((uint)(0x7fffffff / uVar15) < uVar8)) {
      return 0xffff;
    }
    iVar17 = uVar8 * (int)uVar15;
    if (0xffff - iVar18 < iVar17) {
      return 0xffff;
    }
    iVar18 = iVar18 + iVar17;
    break;
  case 0x75:
    pPVar11 = startcode + pPVar13[1];
    uVar2 = pPVar11[2];
    pPVar10 = pPVar11;
    if (local_5c == uVar2) {
      iVar18 = iVar18 + local_60;
    }
    else {
      do {
        pPVar10 = pPVar10 + pPVar10[1];
      } while (*pPVar10 == 0x78);
      if ((pPVar11 < pPVar13) && (pPVar13 < pPVar10)) {
LAB_0015d7a3:
        bVar5 = true;
      }
      else {
        prVar12 = recurses;
        if (recurses != (recurse_check *)0x0) {
          do {
            if (prVar12->group == pPVar11) goto LAB_0015d7a3;
            pprVar6 = &prVar12->prev;
            prVar12 = *pprVar6;
          } while (*pprVar6 != (recurse_check *)0x0);
        }
        local_40.prev = recurses;
        local_40.group = pPVar11;
        local_60 = find_minlength(re,pPVar11,startcode,utf,&local_40,countptr,backref_cache);
        if (local_60 < 0) {
          return local_60;
        }
        iVar18 = iVar18 + local_60;
        local_5c = (uint)uVar2;
      }
    }
    puVar14 = pPVar13 + (ulong)local_68 + 2;
    local_68 = 0;
    break;
  case 0x77:
    uVar15 = (ulong)pPVar13[3];
    goto LAB_0015d1bd;
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
    do {
      pPVar13 = pPVar13 + pPVar13[1];
      uVar15 = (ulong)*pPVar13;
    } while (*pPVar13 == 0x78);
  case 1:
  case 2:
  case 4:
  case 5:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x76:
  case 0x7d:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
    goto switchD_0015d1ad_caseD_3;
  case 0x82:
  case 0x84:
  case 0x88:
  case 0x89:
    goto switchD_0015d1ad_caseD_82;
  case 0x83:
    if ((pPVar13[2] != 0x75) || (pPVar13[4] != 0x79)) goto switchD_0015d1ad_caseD_82;
    puVar14 = pPVar13 + 2;
    local_68 = 2;
    break;
  case 0x85:
  case 0x86:
  case 0x8a:
  case 0x8b:
    uVar2 = pPVar13[2];
    if ((((uVar3 >> 0x15 & 1) != 0) || (local_58 != uVar2)) &&
       (local_54 = find_minlength(re,pPVar13,startcode,utf,recurses,countptr,backref_cache),
       local_58 = (uint)uVar2, local_54 < 0)) {
      return local_54;
    }
    do {
      pPVar13 = pPVar13 + pPVar13[1];
    } while (*pPVar13 == 0x78);
    iVar18 = iVar18 + local_54;
LAB_0015d1e7:
    puVar14 = pPVar13 + 2;
    break;
  case 0x87:
  case 0x8c:
    if (pPVar13[pPVar13[1]] != 0x78) {
      pPVar13 = pPVar13 + pPVar13[1];
      goto LAB_0015d318;
    }
    goto switchD_0015d1ad_caseD_82;
  case 0x93:
  case 0x94:
  case 0x95:
  case 0xa3:
    pPVar13 = pPVar13 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                        [uVar15];
    do {
      pPVar13 = pPVar13 + pPVar13[1];
    } while (*pPVar13 == 0x78);
LAB_0015d318:
    puVar14 = pPVar13 + 2;
    break;
  case 0x96:
  case 0x98:
  case 0x9a:
  case 0x9c:
  case 0x9e:
    puVar14 = pPVar13 + ((uint)pPVar13[1] +
                        (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                              [uVar15]);
    break;
  case 0xa0:
  case 0xa1:
    return -1;
  }
LAB_0015d61f:
  pPVar13 = puVar14;
  if (0xfffe < iVar18) {
    return 0xffff;
  }
  goto LAB_0015d18f;
switchD_0015d1ad_caseD_82:
  uVar7 = find_minlength(re,pPVar13,startcode,utf,recurses,countptr,backref_cache);
  if ((int)uVar7 < 0) {
    return uVar7;
  }
  do {
    pPVar13 = pPVar13 + pPVar13[1];
  } while (*pPVar13 == 0x78);
  puVar14 = pPVar13 + 2;
LAB_0015d74d:
  iVar18 = iVar18 + uVar7;
  goto LAB_0015d61f;
switchD_0015d1ad_caseD_3:
  uVar15 = (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                  [uVar15];
LAB_0015d1bd:
  puVar14 = pPVar13 + uVar15;
  goto LAB_0015d61f;
}

Assistant:

static int
find_minlength(const pcre2_real_code *re, PCRE2_SPTR code,
  PCRE2_SPTR startcode, BOOL utf, recurse_check *recurses, int *countptr,
  int *backref_cache)
{
int length = -1;
int prev_cap_recno = -1;
int prev_cap_d = 0;
int prev_recurse_recno = -1;
int prev_recurse_d = 0;
uint32_t once_fudge = 0;
BOOL had_recurse = FALSE;
BOOL dupcapused = (re->flags & PCRE2_DUPCAPUSED) != 0;
recurse_check this_recurse;
int branchlength = 0;
PCRE2_UCHAR *cc = (PCRE2_UCHAR *)code + 1 + LINK_SIZE;

/* If this is a "could be empty" group, its minimum length is 0. */

if (*code >= OP_SBRA && *code <= OP_SCOND) return 0;

/* Skip over capturing bracket number */

if (*code == OP_CBRA || *code == OP_CBRAPOS) cc += IMM2_SIZE;

/* A large and/or complex regex can take too long to process. */

if ((*countptr)++ > 1000) return -1;

/* Scan along the opcodes for this branch. If we get to the end of the branch,
check the length against that of the other branches. If the accumulated length
passes 16-bits, stop. */

for (;;)
  {
  int d, min, recno;
  PCRE2_UCHAR *cs, *ce;
  PCRE2_UCHAR op = *cc;

  if (branchlength >= UINT16_MAX) return UINT16_MAX;

  switch (op)
    {
    case OP_COND:
    case OP_SCOND:

    /* If there is only one branch in a condition, the implied branch has zero
    length, so we don't add anything. This covers the DEFINE "condition"
    automatically. If there are two branches we can treat it the same as any
    other non-capturing subpattern. */

    cs = cc + GET(cc, 1);
    if (*cs != OP_ALT)
      {
      cc = cs + 1 + LINK_SIZE;
      break;
      }
    goto PROCESS_NON_CAPTURE;

    case OP_BRA:
    /* There's a special case of OP_BRA, when it is wrapped round a repeated
    OP_RECURSE. We'd like to process the latter at this level so that
    remembering the value works for repeated cases. So we do nothing, but
    set a fudge value to skip over the OP_KET after the recurse. */

    if (cc[1+LINK_SIZE] == OP_RECURSE && cc[2*(1+LINK_SIZE)] == OP_KET)
      {
      once_fudge = 1 + LINK_SIZE;
      cc += 1 + LINK_SIZE;
      break;
      }
    /* Fall through */

    case OP_ONCE:
    case OP_SBRA:
    case OP_BRAPOS:
    case OP_SBRAPOS:
    PROCESS_NON_CAPTURE:
    d = find_minlength(re, cc, startcode, utf, recurses, countptr,
      backref_cache);
    if (d < 0) return d;
    branchlength += d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* To save time for repeated capturing subpatterns, we remember the
    length of the previous one. Unfortunately we can't do the same for
    the unnumbered ones above. Nor can we do this if (?| is present in the
    pattern because captures with the same number are not then identical. */

    case OP_CBRA:
    case OP_SCBRA:
    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    recno = (int)GET2(cc, 1+LINK_SIZE);
    if (dupcapused || recno != prev_cap_recno)
      {
      prev_cap_recno = recno;
      prev_cap_d = find_minlength(re, cc, startcode, utf, recurses, countptr,
        backref_cache);
      if (prev_cap_d < 0) return prev_cap_d;
      }
    branchlength += prev_cap_d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* ACCEPT makes things far too complicated; we have to give up. */

    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    return -1;

    /* Reached end of a branch; if it's a ket it is the end of a nested
    call. If it's ALT it is an alternation in a nested call. If it is END it's
    the end of the outer call. All can be handled by the same code. If an
    ACCEPT was previously encountered, use the length that was in force at that
    time, and pass back the shortest ACCEPT length. */

    case OP_ALT:
    case OP_KET:
    case OP_KETRMAX:
    case OP_KETRMIN:
    case OP_KETRPOS:
    case OP_END:
    if (length < 0 || (!had_recurse && branchlength < length))
      length = branchlength;
    if (op != OP_ALT) return length;
    cc += 1 + LINK_SIZE;
    branchlength = 0;
    had_recurse = FALSE;
    break;

    /* Skip over assertive subpatterns */

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    /* Fall through */

    /* Skip over things that don't match chars */

    case OP_REVERSE:
    case OP_CREF:
    case OP_DNCREF:
    case OP_RREF:
    case OP_DNRREF:
    case OP_FALSE:
    case OP_TRUE:
    case OP_CALLOUT:
    case OP_SOD:
    case OP_SOM:
    case OP_EOD:
    case OP_EODN:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    cc += PRIV(OP_lengths)[*cc];
    break;

    case OP_CALLOUT_STR:
    cc += GET(cc, 1 + 2*LINK_SIZE);
    break;

    /* Skip over a subpattern that has a {0} or {0,x} quantifier */

    case OP_BRAZERO:
    case OP_BRAMINZERO:
    case OP_BRAPOSZERO:
    case OP_SKIPZERO:
    cc += PRIV(OP_lengths)[*cc];
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* Handle literal characters and + repetitions */

    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_PLUS:
    case OP_PLUSI:
    case OP_MINPLUS:
    case OP_MINPLUSI:
    case OP_POSPLUS:
    case OP_POSPLUSI:
    case OP_NOTPLUS:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUS:
    case OP_NOTMINPLUSI:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSPLUSI:
    branchlength++;
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEPOSPLUS:
    branchlength++;
    cc += (cc[1] == OP_PROP || cc[1] == OP_NOTPROP)? 4 : 2;
    break;

    /* Handle exact repetitions. The count is already in characters, but we
    may need to skip over a multibyte character in UTF mode.  */

    case OP_EXACT:
    case OP_EXACTI:
    case OP_NOTEXACT:
    case OP_NOTEXACTI:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEEXACT:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE + ((cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP)? 2 : 0);
    break;

    /* Handle single-char non-literal matchers */

    case OP_PROP:
    case OP_NOTPROP:
    cc += 2;
    /* Fall through */

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_EXTUNI:
    case OP_HSPACE:
    case OP_NOT_HSPACE:
    case OP_VSPACE:
    case OP_NOT_VSPACE:
    branchlength++;
    cc++;
    break;

    /* "Any newline" might match two characters, but it also might match just
    one. */

    case OP_ANYNL:
    branchlength += 1;
    cc++;
    break;

    /* The single-byte matcher means we can't proceed in UTF mode. (In
    non-UTF mode \C will actually be turned into OP_ALLANY, so won't ever
    appear, but leave the code, just in case.) */

    case OP_ANYBYTE:
#ifdef SUPPORT_UNICODE
    if (utf) return -1;
#endif
    branchlength++;
    cc++;
    break;

    /* For repeated character types, we have to test for \p and \P, which have
    an extra two bytes of parameters. */

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSQUERY:
    if (cc[1] == OP_PROP || cc[1] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEPOSUPTO:
    if (cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    /* Check a class for variable quantification */

    case OP_CLASS:
    case OP_NCLASS:
#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    /* The original code caused an unsigned overflow in 64 bit systems,
    so now we use a conditional statement. */
    if (op == OP_XCLASS)
      cc += GET(cc, 1);
    else
      cc += PRIV(OP_lengths)[OP_CLASS];
#else
    cc += PRIV(OP_lengths)[OP_CLASS];
#endif

    switch (*cc)
      {
      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      branchlength++;
      /* Fall through */

      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      branchlength += GET2(cc,1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      branchlength++;
      break;
      }
    break;

    /* Backreferences and subroutine calls (OP_RECURSE) are treated in the same
    way: we find the minimum length for the subpattern. A recursion
    (backreference or subroutine) causes an a flag to be set that causes the
    length of this branch to be ignored. The logic is that a recursion can only
    make sense if there is another alternative that stops the recursing. That
    will provide the minimum length (when no recursion happens).

    If PCRE2_MATCH_UNSET_BACKREF is set, a backreference to an unset bracket
    matches an empty string (by default it causes a matching failure), so in
    that case we must set the minimum length to zero. */

    /* Duplicate named pattern back reference. We cannot reliably find a length
    for this if duplicate numbers are present in the pattern. */

    case OP_DNREF:
    case OP_DNREFI:
    if (dupcapused) return -1;
    if ((re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
      {
      int count = GET2(cc, 1+IMM2_SIZE);
      PCRE2_UCHAR *slot =
        (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
          GET2(cc, 1) * re->name_entry_size;

      d = INT_MAX;

      /* Scan all groups with the same name; find the shortest. */

      while (count-- > 0)
        {
        int dd, i;
        recno = GET2(slot, 0);

        if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
          dd = backref_cache[recno];
        else
          {
          ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
          if (cs == NULL) return -2;
          do ce += GET(ce, 1); while (*ce == OP_ALT);
          if (cc > cs && cc < ce)    /* Simple recursion */
            {
            dd = 0;
            had_recurse = TRUE;
            }
          else
            {
            recurse_check *r = recurses;
            for (r = recurses; r != NULL; r = r->prev)
              if (r->group == cs) break;
            if (r != NULL)           /* Mutual recursion */
              {
              dd = 0;
              had_recurse = TRUE;
              }
            else
              {
              this_recurse.prev = recurses;
              this_recurse.group = cs;
              dd = find_minlength(re, cs, startcode, utf, &this_recurse,
                countptr, backref_cache);
              if (dd < 0) return dd;
              }
            }

          backref_cache[recno] = dd;
          for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
          backref_cache[0] = recno;
          }

        if (dd < d) d = dd;
        if (d <= 0) break;    /* No point looking at any more */
        slot += re->name_entry_size;
        }
      }
    else d = 0;
    cc += 1 + 2*IMM2_SIZE;
    goto REPEAT_BACK_REFERENCE;

    /* Single back reference. We cannot find a length for this if duplicate
    numbers are present in the pattern. */

    case OP_REF:
    case OP_REFI:
    if (dupcapused) return -1;
    recno = GET2(cc, 1);
    if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
      d = backref_cache[recno];
    else
      {
      int i;
      if ((re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
        {
        ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
        if (cs == NULL) return -2;
        do ce += GET(ce, 1); while (*ce == OP_ALT);
        if (cc > cs && cc < ce)    /* Simple recursion */
          {
          d = 0;
          had_recurse = TRUE;
          }
        else
          {
          recurse_check *r = recurses;
          for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
          if (r != NULL)           /* Mutual recursion */
            {
            d = 0;
            had_recurse = TRUE;
            }
          else
            {
            this_recurse.prev = recurses;
            this_recurse.group = cs;
            d = find_minlength(re, cs, startcode, utf, &this_recurse, countptr,
              backref_cache);
            if (d < 0) return d;
            }
          }
        }
      else d = 0;

      backref_cache[recno] = d;
      for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
      backref_cache[0] = recno;
      }

    cc += 1 + IMM2_SIZE;

    /* Handle repeated back references */

    REPEAT_BACK_REFERENCE:
    switch (*cc)
      {
      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      min = 0;
      cc++;
      break;

      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      min = 1;
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      min = GET2(cc, 1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      min = 1;
      break;
      }

     /* Take care not to overflow: (1) min and d are ints, so check that their
     product is not greater than INT_MAX. (2) branchlength is limited to
     UINT16_MAX (checked at the top of the loop). */

    if ((d > 0 && (INT_MAX/d) < min) || UINT16_MAX - branchlength < min*d)
      branchlength = UINT16_MAX;
    else branchlength += min * d;
    break;

    /* Recursion always refers to the first occurrence of a subpattern with a
    given number. Therefore, we can always make use of caching, even when the
    pattern contains multiple subpatterns with the same number. */

    case OP_RECURSE:
    cs = ce = (PCRE2_UCHAR *)startcode + GET(cc, 1);
    recno = GET2(cs, 1+LINK_SIZE);
    if (recno == prev_recurse_recno)
      {
      branchlength += prev_recurse_d;
      }
    else
      {
      do ce += GET(ce, 1); while (*ce == OP_ALT);
      if (cc > cs && cc < ce)    /* Simple recursion */
        had_recurse = TRUE;
      else
        {
        recurse_check *r = recurses;
        for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
        if (r != NULL)          /* Mutual recursion */
          had_recurse = TRUE;
        else
          {
          this_recurse.prev = recurses;
          this_recurse.group = cs;
          prev_recurse_d = find_minlength(re, cs, startcode, utf, &this_recurse,
            countptr, backref_cache);
          if (prev_recurse_d < 0) return prev_recurse_d;
          prev_recurse_recno = recno;
          branchlength += prev_recurse_d;
          }
        }
      }
    cc += 1 + LINK_SIZE + once_fudge;
    once_fudge = 0;
    break;

    /* Anything else does not or need not match a character. We can get the
    item's length from the table, but for those that can match zero occurrences
    of a character, we must take special action for UTF-8 characters. As it
    happens, the "NOT" versions of these opcodes are used at present only for
    ASCII characters, so they could be omitted from this list. However, in
    future that may change, so we include them here so as not to leave a
    gotcha for a future maintainer. */

    case OP_UPTO:
    case OP_UPTOI:
    case OP_NOTUPTO:
    case OP_NOTUPTOI:
    case OP_MINUPTO:
    case OP_MINUPTOI:
    case OP_NOTMINUPTO:
    case OP_NOTMINUPTOI:
    case OP_POSUPTO:
    case OP_POSUPTOI:
    case OP_NOTPOSUPTO:
    case OP_NOTPOSUPTOI:

    case OP_STAR:
    case OP_STARI:
    case OP_NOTSTAR:
    case OP_NOTSTARI:
    case OP_MINSTAR:
    case OP_MINSTARI:
    case OP_NOTMINSTAR:
    case OP_NOTMINSTARI:
    case OP_POSSTAR:
    case OP_POSSTARI:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSSTARI:

    case OP_QUERY:
    case OP_QUERYI:
    case OP_NOTQUERY:
    case OP_NOTQUERYI:
    case OP_MINQUERY:
    case OP_MINQUERYI:
    case OP_NOTMINQUERY:
    case OP_NOTMINQUERYI:
    case OP_POSQUERY:
    case OP_POSQUERYI:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSQUERYI:

    cc += PRIV(OP_lengths)[op];
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    /* Skip these, but we need to add in the name length. */

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    cc += PRIV(OP_lengths)[op] + cc[1];
    break;

    /* The remaining opcodes are just skipped over. */

    case OP_CLOSE:
    case OP_COMMIT:
    case OP_FAIL:
    case OP_PRUNE:
    case OP_SET_SOM:
    case OP_SKIP:
    case OP_THEN:
    cc += PRIV(OP_lengths)[op];
    break;

    /* This should not occur: we list all opcodes explicitly so that when
    new ones get added they are properly considered. */

    default:
    return -3;
    }
  }
/* Control never gets here */
}